

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O0

int64_t HighsIntegers::denominator(double x,double eps,int64_t maxdenom)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int __x;
  long in_RDI;
  HighsCDouble *pHVar4;
  double in_XMM0_Qa;
  double dVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsCDouble HVar6;
  double err1;
  double err0;
  double x1;
  double x0;
  int64_t t;
  HighsCDouble fraction;
  HighsCDouble xi;
  int64_t m [4];
  int64_t ai;
  double in_stack_ffffffffffffff48;
  HighsCDouble *in_stack_ffffffffffffff50;
  HighsCDouble *in_stack_ffffffffffffff58;
  double in_stack_ffffffffffffff60;
  double local_78;
  double local_70;
  HighsCDouble local_68;
  HighsCDouble local_58;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_8;
  
  local_48 = (long)in_XMM0_Qa;
  local_40 = 1;
  local_38 = 1;
  local_30 = 0;
  local_28 = local_48;
  local_20 = in_RDI;
  HighsCDouble::HighsCDouble(&local_58,in_XMM0_Qa);
  local_68 = HighsCDouble::operator-(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  while( true ) {
    __x = (int)&local_68;
    bVar1 = HighsCDouble::operator>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (!bVar1) break;
    HVar6 = operator/(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_78 = HVar6.hi;
    local_58.hi = local_78;
    local_70 = HVar6.lo;
    local_58.lo = local_70;
    pHVar4 = &local_58;
    dVar5 = HighsCDouble::operator_cast_to_double(pHVar4);
    __x = (int)pHVar4;
    if (9007199254740992.0 < dVar5) break;
    pHVar4 = &local_58;
    dVar5 = HighsCDouble::operator_cast_to_double(pHVar4);
    __x = (int)pHVar4;
    local_28 = (long)dVar5;
    lVar2 = local_38 * local_28 + local_30;
    if (local_20 < lVar2) break;
    local_30 = local_38;
    lVar3 = local_48 * local_28 + local_40;
    local_40 = local_48;
    local_48 = lVar3;
    local_38 = lVar2;
    local_68 = HighsCDouble::operator-(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  local_28 = (local_20 - local_30) / local_38;
  local_40 = local_48 * local_28 + local_40;
  local_30 = local_38 * local_28 + local_30;
  std::abs(__x);
  std::abs(__x);
  dVar5 = extraout_XMM0_Qa;
  std::abs(__x);
  if (extraout_XMM0_Qa_00 <= dVar5) {
    local_8 = local_30;
  }
  else {
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

static int64_t denominator(double x, double eps, int64_t maxdenom) {
    int64_t ai = (int64_t)x;
    int64_t m[] = {ai, 1, 1, 0};

    HighsCDouble xi = x;
    HighsCDouble fraction = xi - double(ai);

    while (fraction > eps) {
      xi = 1.0 / fraction;
      if (double(xi) > double(int64_t{1} << 53)) break;

      ai = (int64_t)(double)xi;
      int64_t t = m[2] * ai + m[3];
      if (t > maxdenom) break;

      m[3] = m[2];
      m[2] = t;

      t = m[0] * ai + m[1];
      m[1] = m[0];
      m[0] = t;

      fraction = xi - ai;
    }

    ai = (maxdenom - m[3]) / m[2];
    m[1] += m[0] * ai;
    m[3] += m[2] * ai;

    double x0 = static_cast<double>(m[0]) / static_cast<double>(m[2]);
    double x1 = static_cast<double>(m[1]) / static_cast<double>(m[3]);
    x = std::abs(x);
    double err0 = std::abs(x - x0);
    double err1 = std::abs(x - x1);

    if (err0 < err1) return m[2];
    return m[3];
  }